

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  PolicyStatus PVar1;
  pointer pPVar2;
  cmState *this_00;
  char *pcVar3;
  PolicyID id_00;
  bool local_c1;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  undefined1 local_60 [16];
  reverse_iterator psi;
  bool previous_was_weak;
  undefined1 local_40 [8];
  string msg;
  PolicyStatus status_local;
  PolicyID id_local;
  cmMakefile *this_local;
  
  msg.field_2._8_4_ = status;
  msg.field_2._12_4_ = id;
  if ((status == NEW) || (PVar1 = cmPolicies::GetPolicyStatus(id), PVar1 != REQUIRED_ALWAYS)) {
    psi.current._M_current._3_1_ = 1;
    std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>::rbegin
              ((vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
                *)(local_60 + 8));
    while( true ) {
      local_c1 = false;
      if ((psi.current._M_current._3_1_ & 1) != 0) {
        std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>::
        rend((vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_> *)
             local_60);
        local_c1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
                                    *)(local_60 + 8),
                                   (reverse_iterator<__gnu_cxx::__normal_iterator<cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
                                    *)local_60);
      }
      if (local_c1 == false) break;
      pPVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
                             *)(local_60 + 8));
      cmPolicies::PolicyMap::Set(&pPVar2->super_PolicyMap,msg.field_2._12_4_,msg.field_2._8_4_);
      pPVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
                             *)(local_60 + 8));
      psi.current._M_current._3_1_ = pPVar2->Weak & 1;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
                    *)(local_60 + 8));
    }
    if ((msg.field_2._12_4_ == 1) && ((msg.field_2._8_4_ == 1 || (msg.field_2._8_4_ == 0)))) {
      this_00 = GetState(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"CMAKE_BACKWARDS_COMPATIBILITY",&local_81);
      pcVar3 = cmState::GetInitializedCacheValue(this_00,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      if (pcVar3 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a8,"CMAKE_BACKWARDS_COMPATIBILITY",&local_a9);
        AddCacheDefinition(this,&local_a8,"2.4",
                           "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                           ,STRING,false);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_
              ((string *)local_40,(cmPolicies *)(ulong)(uint)msg.field_2._12_4_,id_00);
    IssueMessage(this,FATAL_ERROR,(string *)local_40);
    this_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if(status != cmPolicies::NEW &&
     cmPolicies::GetPolicyStatus(id) ==
     cmPolicies::REQUIRED_ALWAYS)
    {
    std::string msg =
      cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(cmake::FATAL_ERROR, msg);
    return false;
    }

  // Update the policy stack from the top to the top-most strong entry.
  bool previous_was_weak = true;
  for(PolicyStackType::reverse_iterator psi = this->PolicyStack.rbegin();
      previous_was_weak && psi != this->PolicyStack.rend(); ++psi)
    {
    psi->Set(id, status);
    previous_was_weak = psi->Weak;
    }

  // Special hook for presenting compatibility variable as soon as
  // the user requests it.
  if(id == cmPolicies::CMP0001 &&
     (status == cmPolicies::WARN || status == cmPolicies::OLD))
    {
    if(!(this->GetState()
         ->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")))
      {
      // Set it to 2.4 because that is the last version where the
      // variable had meaning.
      this->AddCacheDefinition
        ("CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
         "For backwards compatibility, what version of CMake "
         "commands and "
         "syntax should this version of CMake try to support.",
         cmState::STRING);
      }
    }

  return true;
}